

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_con.h
# Opt level: O0

Context __thiscall
mp::
RangeConstraintConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::LinTerms>
::Convert(RangeConstraintConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::LinTerms>
          *this,ItemType *item,int i)

{
  reference pvVar1;
  double in_RSI;
  double in_RDI;
  array<bool,_3UL> *this_00;
  RangeRelations rr;
  int in_stack_000002a4;
  ItemType *in_stack_000002a8;
  RangeConstraintConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::LinTerms>
  *in_stack_000002b0;
  ItemType *in_stack_000003c0;
  RangeConstraintConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::LinTerms>
  *in_stack_000003c8;
  RangeRelations in_stack_000003d5;
  double lb;
  undefined4 in_stack_fffffffffffffff8;
  Context in_stack_fffffffffffffffc;
  
  lb = in_RDI;
  this_00 = (array<bool,_3UL> *)AlgConRange::lb((AlgConRange *)((long)in_RSI + 0x98));
  AlgConRange::ub((AlgConRange *)((long)in_RSI + 0x98));
  Relate((RangeConstraintConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::LinTerms>
          *)CONCAT44(in_stack_fffffffffffffffc.value_,in_stack_fffffffffffffff8),lb,in_RSI);
  pvVar1 = std::array<bool,_3UL>::operator[](this_00,(size_type)in_RDI);
  if ((*pvVar1 & 1U) != 0) {
    pvVar1 = std::array<bool,_3UL>::operator[](this_00,(size_type)in_RDI);
    if ((*pvVar1 & 1U) != 0) {
      pvVar1 = std::array<bool,_3UL>::operator[](this_00,(size_type)in_RDI);
      if ((*pvVar1 & 1U) != 0) {
        ConvertRange(in_stack_000002b0,in_stack_000002a8,in_stack_000002a4);
        goto LAB_0047a5a4;
      }
    }
  }
  ConvertWithRhs(in_stack_000003c8,in_stack_000003c0,in_stack_000003d5);
LAB_0047a5a4:
  Context::Context((Context *)&stack0xfffffffffffffffc,CTX_ROOT);
  return (Context)in_stack_fffffffffffffffc.value_;
}

Assistant:

Context Convert(const ItemType& item, int i) {
    auto rr = Relate(item.lb(), item.ub());
    if (rr[0] && rr[1] && rr[2])
      ConvertRange(item, i);
    else
      ConvertWithRhs(item, rr);
    return Context::CTX_ROOT;
  }